

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConcentricFinder.h
# Opt level: O2

int __thiscall
ZXing::CheckSymmetricPattern<true,ZXing::FixedPattern<5,7,false>>
          (ZXing *this,BitMatrixCursorI *cur,FixedPattern<5,_7,_false> pattern,int range,
          bool updatePosition)

{
  unsigned_short uVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  uint uVar4;
  int iVar5;
  int i;
  double dVar6;
  char local_c4;
  Pattern<pattern_size()>_conflict res;
  BitMatrixCursorI *local_b0;
  value_type local_a8;
  undefined8 local_a0;
  BitMatrixCursor<ZXing::PointT<int>_> *local_98;
  int s_2;
  int local_8c;
  FastEdgeToEdgeCounter curBwd;
  FastEdgeToEdgeCounter curFwd;
  undefined1 local_68 [16];
  PointT<int> local_58;
  Iterator puStack_50;
  anon_class_24_3_10afa19a next;
  
  local_a8 = pattern._data[0];
  local_b0 = cur;
  FastEdgeToEdgeCounter::FastEdgeToEdgeCounter(&curFwd,(BitMatrixCursorI *)this);
  local_68._0_8_ = *(undefined8 *)this;
  local_68._8_8_ = *(PointT<int> *)(this + 8);
  local_58.y = -*(int *)(this + 0x14);
  local_58.x = -*(int *)(this + 0x10);
  FastEdgeToEdgeCounter::FastEdgeToEdgeCounter(&curBwd,(BitMatrixCursorI *)local_68);
  iVar5 = (int)CONCAT62((int6)((ulong)register0x00000008 >> 0x10),pattern._data[4]);
  iVar2 = FastEdgeToEdgeCounter::stepToNextEdge(&curFwd,iVar5);
  if (iVar2 != 0) {
    iVar3 = FastEdgeToEdgeCounter::stepToNextEdge(&curBwd,iVar5);
    local_a0 = CONCAT44(extraout_var,iVar3);
    if (iVar3 != 0) {
      next.res = &res;
      res._M_elems[4] = 0;
      next.s_2 = &s_2;
      s_2 = 2;
      uVar4 = (iVar3 + iVar2) - 1;
      res._M_elems._0_8_ = (ulong)(ushort)uVar4 << 0x20;
      local_8c = iVar5 - (uVar4 & 0xffff);
      next.range = &local_8c;
      iVar2 = 1;
      iVar5 = -1;
      local_98 = (BitMatrixCursor<ZXing::PointT<int>_> *)this;
      do {
        if (iVar5 == -3) {
          local_68._0_8_ = &res;
          local_68._8_4_ = 5;
          local_58.x = 0;
          local_58.y = 0;
          puStack_50 = (Iterator)0x0;
          dVar6 = IsPattern<true,5,7>((PatternView *)local_68,(FixedPattern<5,_7,_false> *)&local_b0
                                      ,0,0.0,0.0);
          if ((dVar6 == 0.0) && (!NAN(dVar6))) {
            return 0;
          }
          local_c4 = (char)range;
          if (local_c4 != '\0') {
            BitMatrixCursor<ZXing::PointT<int>_>::step
                      (local_98,((uint)(res._M_elems[2] >> 1) - (int)local_a0) + 1);
          }
          uVar1 = Reduce<std::array<unsigned_short,5ul>,unsigned_short,std::plus<unsigned_short>>
                            (&res,0);
          return (uint)uVar1;
        }
        iVar3 = CheckSymmetricPattern<true,ZXing::FixedPattern<5,7,false>>(ZXing::BitMatrixCursor<ZXing::PointT<int>>&,ZXing::FixedPattern<5,7,false>,int,bool)
                ::{lambda(auto:1&,int)#1}::operator()(&next,&curFwd,iVar2);
        if (iVar3 == 0) {
          return 0;
        }
        iVar3 = CheckSymmetricPattern<true,ZXing::FixedPattern<5,7,false>>(ZXing::BitMatrixCursor<ZXing::PointT<int>>&,ZXing::FixedPattern<5,7,false>,int,bool)
                ::{lambda(auto:1&,int)#1}::operator()(&next,&curBwd,iVar5);
        iVar2 = iVar2 + 1;
        iVar5 = iVar5 + -1;
      } while (iVar3 != 0);
    }
  }
  return 0;
}

Assistant:

int CheckSymmetricPattern(BitMatrixCursorI& cur, PATTERN pattern, int range, bool updatePosition)
{
	FastEdgeToEdgeCounter curFwd(cur), curBwd(cur.turnedBack());

	int centerFwd = curFwd.stepToNextEdge(range);
	if (!centerFwd)
		return 0;
	int centerBwd = curBwd.stepToNextEdge(range);
	if (!centerBwd)
		return 0;

	assert(range > 0);
	Pattern<pattern.size()> res = {};
	auto constexpr s_2 = Size(res)/2;
	res[s_2] = centerFwd + centerBwd - 1; // -1 because the starting pixel is counted twice
	range -= res[s_2];

	auto next = [&](auto& cur, int i) {
		auto v = cur.stepToNextEdge(range);
		res[s_2 + i] = v;
		range -= v;
		return v;
	};

	for (int i = 1; i <= s_2; ++i) {
		if (!next(curFwd, i) || !next(curBwd, -i))
			return 0;
	}

	if (!IsPattern<RELAXED_THRESHOLD>(res, pattern))
		return 0;

	if (updatePosition)
		cur.step(res[s_2] / 2 - (centerBwd - 1));

	return Reduce(res);
}